

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O3

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::reorderPatternsByPartition
          (BeagleCPUImpl<double,_1,_0> *this)

{
  uint uVar1;
  uint uVar2;
  int *piVar3;
  int *piVar4;
  int **ppiVar5;
  double *pdVar6;
  double **ppdVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined8 uVar11;
  byte bVar12;
  byte bVar13;
  long lVar14;
  int iVar15;
  int *piVar16;
  void *__ptr;
  double *pdVar17;
  int iVar18;
  int iVar19;
  long lVar20;
  ulong uVar21;
  long lVar22;
  int iVar23;
  int iVar24;
  ulong uVar25;
  int iVar26;
  double *pdVar27;
  ulong uVar28;
  int iVar29;
  double *pdVar30;
  ushort uVar31;
  undefined1 auVar32 [32];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  void *ptr;
  double *local_38;
  
  iVar23 = -7;
  if (this->kPatternsReordered == false) {
    uVar25 = (ulong)this->kPatternCount;
    piVar16 = (int *)malloc(uVar25 * 4);
    this->gPatternsNewOrder = piVar16;
    uVar28 = (ulong)this->kPartitionCount;
    __ptr = malloc(uVar28 * 4);
    pdVar17 = (double *)malloc(uVar25 * 8);
    if (0 < (long)uVar28) {
      piVar3 = this->gPatternPartitionsStartPatterns;
      lVar20 = 0;
      do {
        piVar3[lVar20] = 0;
        *(undefined4 *)((long)__ptr + lVar20 * 4) = 0;
        lVar20 = lVar20 + 1;
        uVar28 = (ulong)this->kPartitionCount;
      } while (lVar20 < (long)uVar28);
      uVar25 = (ulong)(uint)this->kPatternCount;
    }
    iVar23 = (int)uVar25;
    if (0 < iVar23) {
      piVar3 = this->gPatternPartitions;
      uVar21 = 0;
      do {
        iVar18 = piVar3[uVar21];
        iVar24 = *(int *)((long)__ptr + (long)iVar18 * 4);
        piVar16[uVar21] = iVar24;
        uVar21 = uVar21 + 1;
        *(int *)((long)__ptr + (long)iVar18 * 4) = iVar24 + 1;
      } while ((uVar25 & 0xffffffff) != uVar21);
    }
    piVar3 = this->gPatternPartitionsStartPatterns;
    if ((int)uVar28 < 1) {
      lVar20 = (long)(int)uVar28;
    }
    else {
      auVar33 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar34 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      uVar25 = 0xf;
      lVar22 = 0;
      do {
        if (lVar22 != 0) {
          auVar38 = ZEXT464((uint)piVar3[lVar22]);
          auVar35 = vpbroadcastq_avx512f();
          uVar28 = 0;
          do {
            auVar36 = vpbroadcastq_avx512f();
            auVar37 = vmovdqa64_avx512f(auVar38);
            auVar38 = vporq_avx512f(auVar36,auVar33);
            auVar36 = vporq_avx512f(auVar36,auVar34);
            uVar11 = vpcmpuq_avx512f(auVar36,auVar35,2);
            bVar12 = (byte)uVar11;
            uVar11 = vpcmpuq_avx512f(auVar38,auVar35,2);
            bVar13 = (byte)uVar11;
            uVar31 = CONCAT11(bVar13,bVar12);
            auVar38 = vmovdqu32_avx512f(*(undefined1 (*) [64])((long)__ptr + uVar28 * 4));
            auVar36._4_4_ = (uint)((byte)(uVar31 >> 1) & 1) * auVar38._4_4_;
            auVar36._0_4_ = (uint)(bVar12 & 1) * auVar38._0_4_;
            auVar36._8_4_ = (uint)((byte)(uVar31 >> 2) & 1) * auVar38._8_4_;
            auVar36._12_4_ = (uint)((byte)(uVar31 >> 3) & 1) * auVar38._12_4_;
            auVar36._16_4_ = (uint)((byte)(uVar31 >> 4) & 1) * auVar38._16_4_;
            auVar36._20_4_ = (uint)((byte)(uVar31 >> 5) & 1) * auVar38._20_4_;
            auVar36._24_4_ = (uint)((byte)(uVar31 >> 6) & 1) * auVar38._24_4_;
            auVar36._28_4_ = (uint)((byte)(uVar31 >> 7) & 1) * auVar38._28_4_;
            auVar36._32_4_ = (uint)(bVar13 & 1) * auVar38._32_4_;
            auVar36._36_4_ = (uint)(bVar13 >> 1 & 1) * auVar38._36_4_;
            auVar36._40_4_ = (uint)(bVar13 >> 2 & 1) * auVar38._40_4_;
            auVar36._44_4_ = (uint)(bVar13 >> 3 & 1) * auVar38._44_4_;
            auVar36._48_4_ = (uint)(bVar13 >> 4 & 1) * auVar38._48_4_;
            auVar36._52_4_ = (uint)(bVar13 >> 5 & 1) * auVar38._52_4_;
            auVar36._56_4_ = (uint)(bVar13 >> 6 & 1) * auVar38._56_4_;
            auVar36._60_4_ = (uint)(bVar13 >> 7) * auVar38._60_4_;
            uVar28 = uVar28 + 0x10;
            auVar38 = vpaddd_avx512f(auVar37,auVar36);
          } while ((uVar25 & 0xfffffffffffffff0) != uVar28);
          auVar35 = vmovdqa32_avx512f(auVar38);
          auVar38._0_4_ =
               (uint)(bVar12 & 1) * auVar35._0_4_ | (uint)!(bool)(bVar12 & 1) * auVar37._0_4_;
          bVar8 = (bool)((byte)(uVar31 >> 1) & 1);
          auVar38._4_4_ = (uint)bVar8 * auVar35._4_4_ | (uint)!bVar8 * auVar37._4_4_;
          bVar8 = (bool)((byte)(uVar31 >> 2) & 1);
          auVar38._8_4_ = (uint)bVar8 * auVar35._8_4_ | (uint)!bVar8 * auVar37._8_4_;
          bVar8 = (bool)((byte)(uVar31 >> 3) & 1);
          auVar38._12_4_ = (uint)bVar8 * auVar35._12_4_ | (uint)!bVar8 * auVar37._12_4_;
          bVar8 = (bool)((byte)(uVar31 >> 4) & 1);
          auVar38._16_4_ = (uint)bVar8 * auVar35._16_4_ | (uint)!bVar8 * auVar37._16_4_;
          bVar8 = (bool)((byte)(uVar31 >> 5) & 1);
          auVar38._20_4_ = (uint)bVar8 * auVar35._20_4_ | (uint)!bVar8 * auVar37._20_4_;
          bVar8 = (bool)((byte)(uVar31 >> 6) & 1);
          auVar38._24_4_ = (uint)bVar8 * auVar35._24_4_ | (uint)!bVar8 * auVar37._24_4_;
          bVar8 = (bool)((byte)(uVar31 >> 7) & 1);
          auVar38._28_4_ = (uint)bVar8 * auVar35._28_4_ | (uint)!bVar8 * auVar37._28_4_;
          auVar38._32_4_ =
               (uint)(bVar13 & 1) * auVar35._32_4_ | (uint)!(bool)(bVar13 & 1) * auVar37._32_4_;
          bVar8 = (bool)(bVar13 >> 1 & 1);
          auVar38._36_4_ = (uint)bVar8 * auVar35._36_4_ | (uint)!bVar8 * auVar37._36_4_;
          bVar8 = (bool)(bVar13 >> 2 & 1);
          auVar38._40_4_ = (uint)bVar8 * auVar35._40_4_ | (uint)!bVar8 * auVar37._40_4_;
          bVar8 = (bool)(bVar13 >> 3 & 1);
          auVar38._44_4_ = (uint)bVar8 * auVar35._44_4_ | (uint)!bVar8 * auVar37._44_4_;
          bVar8 = (bool)(bVar13 >> 4 & 1);
          auVar38._48_4_ = (uint)bVar8 * auVar35._48_4_ | (uint)!bVar8 * auVar37._48_4_;
          bVar8 = (bool)(bVar13 >> 5 & 1);
          auVar38._52_4_ = (uint)bVar8 * auVar35._52_4_ | (uint)!bVar8 * auVar37._52_4_;
          bVar8 = (bool)(bVar13 >> 6 & 1);
          auVar38._56_4_ = (uint)bVar8 * auVar35._56_4_ | (uint)!bVar8 * auVar37._56_4_;
          auVar38._60_4_ =
               (uint)(bVar13 >> 7) * auVar35._60_4_ | (uint)!(bool)(bVar13 >> 7) * auVar37._60_4_;
          auVar32 = vextracti64x4_avx512f(auVar38,1);
          auVar35 = vpaddd_avx512f(auVar38,ZEXT3264(auVar32));
          auVar9 = vpaddd_avx(auVar35._0_16_,auVar35._16_16_);
          auVar10 = vpshufd_avx(auVar9,0xee);
          auVar9 = vpaddd_avx(auVar9,auVar10);
          auVar10 = vpshufd_avx(auVar9,0x55);
          auVar9 = vpaddd_avx(auVar9,auVar10);
          piVar3[lVar22] = auVar9._0_4_;
          uVar28 = (ulong)(uint)this->kPartitionCount;
        }
        lVar22 = lVar22 + 1;
        lVar20 = (long)(int)uVar28;
        uVar25 = uVar25 + 1;
      } while (lVar22 < lVar20);
      iVar23 = this->kPatternCount;
    }
    piVar3[lVar20] = iVar23;
    iVar23 = this->kPatternCount;
    if (0 < (long)iVar23) {
      pdVar30 = this->gPatternWeights;
      piVar4 = this->gPatternPartitions;
      lVar20 = 0;
      do {
        iVar18 = piVar16[lVar20];
        iVar24 = piVar3[piVar4[lVar20]];
        piVar16[lVar20] = (int)((long)iVar18 + (long)iVar24);
        pdVar27 = pdVar30 + lVar20;
        lVar20 = lVar20 + 1;
        pdVar17[(long)iVar18 + (long)iVar24] = *pdVar27;
      } while (iVar23 != lVar20);
    }
    iVar23 = this->kPartitionCount;
    if (0 < iVar23) {
      piVar16 = this->gPatternPartitions;
      lVar20 = 0;
      iVar18 = 0;
      do {
        iVar24 = *(int *)((long)__ptr + lVar20 * 4);
        if (0 < iVar24) {
          lVar22 = 0;
          do {
            piVar16[iVar18 + lVar22] = (int)lVar20;
            lVar22 = lVar22 + 1;
          } while (iVar24 != (int)lVar22);
          iVar18 = iVar18 + (int)lVar22;
          iVar23 = this->kPartitionCount;
        }
        lVar20 = lVar20 + 1;
      } while (lVar20 < iVar23);
    }
    free(__ptr);
    free(this->gPatternWeights);
    this->gPatternWeights = pdVar17;
    local_38 = (double *)0x0;
    posix_memalign(&local_38,0x20,(long)this->kPartialsSize << 3);
    pdVar17 = local_38;
    local_38 = (double *)0x0;
    posix_memalign(&local_38,0x20,(long)this->kPaddedPatternCount << 2);
    iVar23 = this->kTipCount;
    pdVar30 = local_38;
    if (0 < iVar23) {
      lVar20 = 0;
      pdVar27 = pdVar17;
      do {
        ppiVar5 = this->gTipStates;
        pdVar6 = (double *)ppiVar5[lVar20];
        if (pdVar6 == (double *)0x0) {
          ppdVar7 = this->gPartials;
          iVar18 = this->kCategoryCount;
          pdVar17 = ppdVar7[lVar20];
          if (0 < iVar18) {
            iVar26 = 0;
            iVar24 = 0;
            uVar1 = this->kPatternCount;
            uVar2 = this->kStateCount;
            do {
              if (0 < (int)uVar1) {
                uVar25 = 0;
                piVar16 = this->gPatternsNewOrder;
                iVar29 = iVar26;
                do {
                  if (0 < (int)uVar2) {
                    iVar19 = piVar16[uVar25] * uVar2 + iVar26;
                    uVar28 = (ulong)uVar2;
                    iVar15 = iVar29;
                    do {
                      lVar22 = (long)iVar15;
                      iVar15 = iVar15 + 1;
                      pdVar27[iVar19] = pdVar17[lVar22];
                      iVar19 = iVar19 + 1;
                      uVar28 = uVar28 - 1;
                    } while (uVar28 != 0);
                  }
                  uVar25 = uVar25 + 1;
                  iVar29 = iVar29 + uVar2;
                } while (uVar25 != uVar1);
              }
              iVar24 = iVar24 + 1;
              iVar26 = iVar26 + uVar1 * uVar2;
            } while (iVar24 != iVar18);
          }
          ppdVar7[lVar20] = pdVar27;
        }
        else {
          if (0 < this->kPatternCount) {
            piVar16 = this->gPatternsNewOrder;
            lVar22 = 0;
            do {
              piVar3 = piVar16 + lVar22;
              lVar14 = lVar22 * 4;
              lVar22 = lVar22 + 1;
              *(int *)((long)pdVar30 + (long)*piVar3 * 4) = *(int *)((long)pdVar6 + lVar14);
            } while (lVar22 < this->kPatternCount);
            iVar23 = this->kTipCount;
          }
          ppiVar5[lVar20] = (int *)pdVar30;
          pdVar17 = pdVar27;
          pdVar30 = pdVar6;
        }
        lVar20 = lVar20 + 1;
        pdVar27 = pdVar17;
      } while (lVar20 < iVar23);
    }
    free(pdVar17);
    free(pdVar30);
    iVar23 = 0;
    this->kPatternsReordered = true;
  }
  return iVar23;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::reorderPatternsByPartition() {

    if (!kPatternsReordered) {
        gPatternsNewOrder = (int*) malloc(kPatternCount * sizeof(int));
    } else {
        return BEAGLE_ERROR_NO_IMPLEMENTATION;
    }

    int* partitionSizes = (int*) malloc(kPartitionCount * sizeof(int));
    double* sortedPatternWeights = (double*) malloc(sizeof(double) * kPatternCount);

    for (int i=0; i < kPartitionCount; i++) {
        gPatternPartitionsStartPatterns[i] = 0;
        partitionSizes[i] = 0;
    }

    for (int i=0; i < kPatternCount; i++) {
         gPatternsNewOrder[i] = partitionSizes[gPatternPartitions[i]]++;
    }

    for (int i=0; i < kPartitionCount; i++) {
        for (int j=0; j < i; j++) {
            gPatternPartitionsStartPatterns[i] += partitionSizes[j];
        }
    }
    gPatternPartitionsStartPatterns[kPartitionCount] = kPatternCount;

    for (int i=0; i < kPatternCount; i++) {
        gPatternsNewOrder[i] += gPatternPartitionsStartPatterns[gPatternPartitions[i]];
        sortedPatternWeights[gPatternsNewOrder[i]] = gPatternWeights[i];
    }


    int currentPattern = 0;
    for (int i=0; i < kPartitionCount; i++) {
        for (int j=0; j < partitionSizes[i]; j++) {
            gPatternPartitions[currentPattern++] = i;
        }
    }

    free(partitionSizes);
    free(gPatternWeights);
    gPatternWeights = sortedPatternWeights;

    REALTYPE* sortedPartials = (REALTYPE*) mallocAligned(sizeof(REALTYPE) * kPartialsSize);
    int* sortedTips = (int*) mallocAligned(sizeof(int) * kPaddedPatternCount);

    for (int tip=0; tip < kTipCount; tip++) {
        if (gTipStates[tip] == NULL) {
            REALTYPE* unsortedPartials = gPartials[tip];
            for (int l=0; l < kCategoryCount; l++) {
                for (int i=0; i < kPatternCount; i++) {
                    for (int j=0; j < kStateCount; j++) {
                        int sortIndex = l*kStateCount*kPatternCount + gPatternsNewOrder[i]*kStateCount + j;
                        int pIndex = l*kStateCount*kPatternCount + i*kStateCount + j;
                        sortedPartials[sortIndex] = unsortedPartials[pIndex];
                    }
                }
            }
            gPartials[tip] = sortedPartials;
            sortedPartials = unsortedPartials;
        } else {
            int* unsortedTips = gTipStates[tip];
            for (int i=0; i < kPatternCount; i++) {
                int sortIndex = gPatternsNewOrder[i];
                int pIndex = i;
                sortedTips[sortIndex] = unsortedTips[pIndex];
            }
            gTipStates[tip] = sortedTips;
            sortedTips = unsortedTips;
        }
    }

    free(sortedPartials);
    free(sortedTips);

    kPatternsReordered = true;

    return BEAGLE_SUCCESS;
}